

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O3

Vec_Ptr_t * Hop_ManDfs(Hop_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = p->nObjs[4];
  iVar2 = p->nObjs[5];
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < (iVar2 + iVar3) - 1U) {
    iVar5 = iVar2 + iVar3;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar5 << 3);
  }
  vNodes->pArray = ppvVar4;
  iVar3 = p->nTableSize;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      if (p->pTable[lVar6] != (Hop_Obj_t *)0x0) {
        Hop_ManDfs_rec(p->pTable[lVar6],vNodes);
        iVar3 = p->nTableSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
    if (0 < iVar3) {
      lVar6 = 0;
      do {
        if (p->pTable[lVar6] != (Hop_Obj_t *)0x0) {
          puVar1 = &p->pTable[lVar6]->field_0x20;
          *puVar1 = *puVar1 & 0xef;
          iVar3 = p->nTableSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar3);
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Hop_ManDfs( Hop_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( Hop_ManNodeNum(p) );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ManDfs_rec( pObj, vNodes );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearMarkA(pObj);
    return vNodes;
}